

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_ascii_strncasecmp(char *s1,char *s2,size_t n)

{
  byte *pbVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    if (n == sVar2) {
      return 0;
    }
    pbVar1 = (byte *)(s1 + sVar2);
    if ((char)""[*pbVar1] < (char)""[(byte)s2[sVar2]]) {
      return -1;
    }
    if ((char)""[(byte)s2[sVar2]] < (char)""[*pbVar1]) {
      return 1;
    }
    sVar2 = sVar2 + 1;
  } while (*pbVar1 != 0);
  return 0;
}

Assistant:

int evutil_ascii_strncasecmp(const char *s1, const char *s2, size_t n)
{
	char c1, c2;
	while (n--) {
		c1 = EVUTIL_TOLOWER_(*s1++);
		c2 = EVUTIL_TOLOWER_(*s2++);
		if (c1 < c2)
			return -1;
		else if (c1 > c2)
			return 1;
		else if (c1 == 0)
			return 0;
	}
	return 0;
}